

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSWorkerMessagePipe * js_new_message_pipe(void)

{
  int iVar1;
  JSWorkerMessagePipe *pJVar2;
  int pipe_fds [2];
  
  iVar1 = pipe(pipe_fds);
  if (-1 < iVar1) {
    pJVar2 = (JSWorkerMessagePipe *)malloc(0x48);
    if (pJVar2 != (JSWorkerMessagePipe *)0x0) {
      pJVar2->ref_count = 1;
      (pJVar2->msg_queue).prev = &pJVar2->msg_queue;
      (pJVar2->msg_queue).next = &pJVar2->msg_queue;
      pthread_mutex_init((pthread_mutex_t *)&pJVar2->mutex,(pthread_mutexattr_t *)0x0);
      pJVar2->read_fd = pipe_fds[0];
      pJVar2->write_fd = pipe_fds[1];
      return pJVar2;
    }
    close(pipe_fds[0]);
    close(pipe_fds[1]);
  }
  return (JSWorkerMessagePipe *)0x0;
}

Assistant:

static JSWorkerMessagePipe *js_new_message_pipe(void)
{
    JSWorkerMessagePipe *ps;
    int pipe_fds[2];
    
    if (pipe(pipe_fds) < 0)
        return NULL;

    ps = malloc(sizeof(*ps));
    if (!ps) {
        close(pipe_fds[0]);
        close(pipe_fds[1]);
        return NULL;
    }
    ps->ref_count = 1;
    init_list_head(&ps->msg_queue);
    pthread_mutex_init(&ps->mutex, NULL);
    ps->read_fd = pipe_fds[0];
    ps->write_fd = pipe_fds[1];
    return ps;
}